

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O2

int cmCTestLaunch::Main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  cmCTestLaunch self;
  
  if (argc == 2) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "ctest --launch: this mode is for internal CTest use only");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = 1;
  }
  else {
    cmCTestLaunch(&self,argc,argv);
    iVar1 = Run(&self);
    ~cmCTestLaunch(&self);
  }
  return iVar1;
}

Assistant:

int cmCTestLaunch::Main(int argc, const char* const argv[])
{
  if (argc == 2) {
    std::cerr << "ctest --launch: this mode is for internal CTest use only"
              << std::endl;
    return 1;
  }
  cmCTestLaunch self(argc, argv);
  return self.Run();
}